

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Windows::BeyondCompareReporter::BeyondCompareReporter(BeyondCompareReporter *this)

{
  initializer_list<ApprovalTests::Reporter_*> __l;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_00;
  iterator ppRVar1;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffffb8;
  undefined1 *puVar2;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *theReporters;
  FirstWorkingReporter *in_stack_ffffffffffffffe0;
  BeyondCompare3Reporter *in_stack_fffffffffffffff0;
  
  this_00 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            operator_new(0x70);
  BeyondCompare4Reporter::BeyondCompare4Reporter
            ((BeyondCompare4Reporter *)in_stack_fffffffffffffff0);
  ppRVar1 = (iterator)operator_new(0x70);
  BeyondCompare3Reporter::BeyondCompare3Reporter(in_stack_fffffffffffffff0);
  puVar2 = &stack0xffffffffffffffc0;
  theReporters = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
                 0x2;
  ::std::allocator<ApprovalTests::Reporter_*>::allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x13916d);
  __l._M_len = (size_type)puVar2;
  __l._M_array = ppRVar1;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (this_00,__l,in_stack_ffffffffffffffb8);
  FirstWorkingReporter::FirstWorkingReporter(in_stack_ffffffffffffffe0,theReporters);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::~vector
            (in_RDI);
  ::std::allocator<ApprovalTests::Reporter_*>::~allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x1391ac);
  (in_RDI->super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__BeyondCompareReporter_002a5358;
  return;
}

Assistant:

BeyondCompareReporter::BeyondCompareReporter()
            : FirstWorkingReporter(
                  {new BeyondCompare4Reporter(), new BeyondCompare3Reporter()})
        {
        }